

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::CaseStatement::ItemGroup>::
emplaceRealloc<slang::ast::CaseStatement::ItemGroup>
          (SmallVectorBase<slang::ast::CaseStatement::ItemGroup> *this,pointer pos,ItemGroup *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pIVar4;
  long lVar5;
  pointer pIVar6;
  pointer pIVar7;
  iterator __result;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::ast::CaseStatement::ItemGroup> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  ItemGroup *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::ast::CaseStatement::ItemGroup> *)0xa374eb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pIVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pIVar4;
  pIVar6 = (pointer)operator_new(0xa3754d);
  pIVar7 = pIVar6 + lVar5 / 0x18;
  (pIVar7->expressions)._M_ptr = (pointer)*in_RDX;
  (pIVar7->expressions)._M_extent._M_extent_value = in_RDX[1];
  (pIVar7->stmt).ptr = (Statement *)in_RDX[2];
  pIVar4 = end(in_RDI);
  if (in_RSI == pIVar4) {
    __result = begin(in_RDI);
    pIVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::CaseStatement::ItemGroup*,slang::ast::CaseStatement::ItemGroup*>
              (in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::ast::CaseStatement::ItemGroup*,slang::ast::CaseStatement::ItemGroup*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pIVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::CaseStatement::ItemGroup*,slang::ast::CaseStatement::ItemGroup*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pIVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pIVar6;
  return pIVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}